

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O0

CURLcode pubkey_pem_to_der(char *pem,uchar **der,size_t *der_len)

{
  char *pcVar1;
  long lVar2;
  char *src;
  CURLcode result;
  size_t pem_len;
  size_t stripped_pem_count;
  size_t pem_count;
  char *end_pos;
  char *begin_pos;
  char *stripped_pem;
  size_t *der_len_local;
  uchar **der_local;
  char *pem_local;
  
  pem_len = 0;
  if (pem == (char *)0x0) {
    pem_local._4_4_ = CURLE_BAD_CONTENT_ENCODING;
  }
  else {
    pcVar1 = strstr(pem,"-----BEGIN PUBLIC KEY-----");
    if (pcVar1 == (char *)0x0) {
      pem_local._4_4_ = CURLE_BAD_CONTENT_ENCODING;
    }
    else {
      lVar2 = (long)pcVar1 - (long)pem;
      if ((lVar2 == 0) || (pem[lVar2 + -1] == '\n')) {
        stripped_pem_count = lVar2 + 0x1a;
        pcVar1 = strstr(pem + stripped_pem_count,"\n-----END PUBLIC KEY-----");
        if (pcVar1 == (char *)0x0) {
          pem_local._4_4_ = CURLE_BAD_CONTENT_ENCODING;
        }
        else {
          src = (char *)(*Curl_cmalloc)((((long)pcVar1 - (long)pem) - stripped_pem_count) + 1);
          if (src == (char *)0x0) {
            pem_local._4_4_ = CURLE_OUT_OF_MEMORY;
          }
          else {
            for (; stripped_pem_count < (ulong)((long)pcVar1 - (long)pem);
                stripped_pem_count = stripped_pem_count + 1) {
              if ((pem[stripped_pem_count] != '\n') && (pem[stripped_pem_count] != '\r')) {
                src[pem_len] = pem[stripped_pem_count];
                pem_len = pem_len + 1;
              }
            }
            src[pem_len] = '\0';
            pem_local._4_4_ = Curl_base64_decode(src,der,der_len);
            (*Curl_cfree)(src);
          }
        }
      }
      else {
        pem_local._4_4_ = CURLE_BAD_CONTENT_ENCODING;
      }
    }
  }
  return pem_local._4_4_;
}

Assistant:

static CURLcode pubkey_pem_to_der(const char *pem,
                                  unsigned char **der, size_t *der_len)
{
  char *stripped_pem, *begin_pos, *end_pos;
  size_t pem_count, stripped_pem_count = 0, pem_len;
  CURLcode result;

  /* if no pem, exit. */
  if(!pem)
    return CURLE_BAD_CONTENT_ENCODING;

  begin_pos = strstr(pem, "-----BEGIN PUBLIC KEY-----");
  if(!begin_pos)
    return CURLE_BAD_CONTENT_ENCODING;

  pem_count = begin_pos - pem;
  /* Invalid if not at beginning AND not directly following \n */
  if(0 != pem_count && '\n' != pem[pem_count - 1])
    return CURLE_BAD_CONTENT_ENCODING;

  /* 26 is length of "-----BEGIN PUBLIC KEY-----" */
  pem_count += 26;

  /* Invalid if not directly following \n */
  end_pos = strstr(pem + pem_count, "\n-----END PUBLIC KEY-----");
  if(!end_pos)
    return CURLE_BAD_CONTENT_ENCODING;

  pem_len = end_pos - pem;

  stripped_pem = malloc(pem_len - pem_count + 1);
  if(!stripped_pem)
    return CURLE_OUT_OF_MEMORY;

  /*
   * Here we loop through the pem array one character at a time between the
   * correct indices, and place each character that is not '\n' or '\r'
   * into the stripped_pem array, which should represent the raw base64 string
   */
  while(pem_count < pem_len) {
    if('\n' != pem[pem_count] && '\r' != pem[pem_count])
      stripped_pem[stripped_pem_count++] = pem[pem_count];
    ++pem_count;
  }
  /* Place the null terminator in the correct place */
  stripped_pem[stripped_pem_count] = '\0';

  result = Curl_base64_decode(stripped_pem, der, der_len);

  Curl_safefree(stripped_pem);

  return result;
}